

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

void __thiscall
slang::ast::PatternCaseStatement::serializeTo(PatternCaseStatement *this,ASTSerializer *serializer)

{
  Pattern *__n;
  Statement *__n_00;
  ItemGroup *item;
  pointer this_00;
  long lVar1;
  string_view sVar2;
  
  sVar2 = ast::toString(this->condition);
  ASTSerializer::write(serializer,9,"condition",sVar2._M_len);
  sVar2 = ast::toString(this->check);
  ASTSerializer::write(serializer,5,"check",sVar2._M_len);
  ASTSerializer::write(serializer,4,"expr",(size_t)this->expr);
  sVar2._M_str = "items";
  sVar2._M_len = 5;
  ASTSerializer::startArray(serializer,sVar2);
  this_00 = (this->items).data_;
  for (lVar1 = (this->items).size_ * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    ASTSerializer::startObject(serializer);
    __n = not_null<const_slang::ast::Pattern_*>::get(&this_00->pattern);
    ASTSerializer::write(serializer,7,"pattern",(size_t)__n);
    if (this_00->filter != (Expression *)0x0) {
      ASTSerializer::write(serializer,6,"filter",(size_t)this_00->filter);
    }
    __n_00 = not_null<const_slang::ast::Statement_*>::get(&this_00->stmt);
    ASTSerializer::write(serializer,4,"stmt",(size_t)__n_00);
    ASTSerializer::endObject(serializer);
    this_00 = this_00 + 1;
  }
  ASTSerializer::endArray(serializer);
  if (this->defaultCase != (Statement *)0x0) {
    ASTSerializer::write(serializer,0xb,"defaultCase",(size_t)this->defaultCase);
    return;
  }
  return;
}

Assistant:

void PatternCaseStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.write("condition", toString(condition));
    serializer.write("check", toString(check));
    serializer.write("expr", expr);
    serializer.startArray("items");
    for (auto const& item : items) {
        serializer.startObject();
        serializer.write("pattern", *item.pattern);

        if (item.filter)
            serializer.write("filter", *item.filter);

        serializer.write("stmt", *item.stmt);
        serializer.endObject();
    }
    serializer.endArray();

    if (defaultCase) {
        serializer.write("defaultCase", *defaultCase);
    }
}